

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darScript.c
# Opt level: O2

Aig_Man_t *
Dar_ManChoice(Aig_Man_t *pAig,int fBalance,int fUpdateLevel,int fConstruct,int nConfMax,
             int nLevelMax,int fVerbose)

{
  abctime aVar1;
  Vec_Ptr_t *p;
  void *pvVar2;
  void *Entry;
  abctime aVar3;
  Aig_Man_t *pAVar4;
  Aig_Man_t *p_00;
  void *Entry_00;
  int iVar5;
  Vec_Ptr_t *pVVar6;
  
  aVar1 = Abc_Clock();
  p = Dar_ManChoiceSynthesis(pAig,fBalance,fUpdateLevel,0,fVerbose);
  iVar5 = (int)pAig;
  if (fConstruct == 0) {
    pvVar2 = Vec_PtrPop(p);
    Entry = Vec_PtrEntry(p,0);
    Vec_PtrPush(p,Entry);
    pVVar6 = p;
    Vec_PtrWriteEntry(p,(int)pvVar2,Entry_00);
    iVar5 = (int)pVVar6;
  }
  if (fVerbose != 0) {
    Abc_Print(iVar5,"%s =","Synthesis time");
    aVar3 = Abc_Clock();
    Abc_Print(iVar5,"%9.2f sec\n",(double)(aVar3 - aVar1) / 1000000.0);
  }
  aVar1 = Abc_Clock();
  if (fConstruct == 0) {
    pAVar4 = Aig_ManChoicePartitioned(p,300,nConfMax,nLevelMax,fVerbose);
  }
  else {
    pAVar4 = Aig_ManChoiceConstructive(p,fVerbose);
  }
  for (iVar5 = 0; iVar5 < p->nSize; iVar5 = iVar5 + 1) {
    p_00 = (Aig_Man_t *)Vec_PtrEntry(p,iVar5);
    Aig_ManStop(p_00);
  }
  Vec_PtrFree(p);
  iVar5 = (int)p;
  if (fVerbose != 0) {
    Abc_Print(iVar5,"%s =","Choicing time ");
    aVar3 = Abc_Clock();
    Abc_Print(iVar5,"%9.2f sec\n",(double)(aVar3 - aVar1) / 1000000.0);
  }
  return pAVar4;
}

Assistant:

Aig_Man_t * Dar_ManChoice( Aig_Man_t * pAig, int fBalance, int fUpdateLevel, int fConstruct, int nConfMax, int nLevelMax, int fVerbose )
{
    Aig_Man_t * pMan, * pTemp;
    Vec_Ptr_t * vAigs;
    int i;
    abctime clk;

clk = Abc_Clock();
//    vAigs = Dar_ManChoiceSynthesisExt();
    vAigs = Dar_ManChoiceSynthesis( pAig, fBalance, fUpdateLevel, 0, fVerbose );

    // swap the first and last network
    // this should lead to the primary choice being "better" because of synthesis
    // (it is also important when constructing choices)
    if ( !fConstruct )
    {
        pMan = (Aig_Man_t *)Vec_PtrPop( vAigs );
        Vec_PtrPush( vAigs, Vec_PtrEntry(vAigs,0) );
        Vec_PtrWriteEntry( vAigs, 0, pMan );
    }

if ( fVerbose )
{
ABC_PRT( "Synthesis time", Abc_Clock() - clk );
}
clk = Abc_Clock();
    if ( fConstruct )
        pMan = Aig_ManChoiceConstructive( vAigs, fVerbose );
    else
        pMan = Aig_ManChoicePartitioned( vAigs, 300, nConfMax, nLevelMax, fVerbose );
    Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pTemp, i )
        Aig_ManStop( pTemp );
    Vec_PtrFree( vAigs );
if ( fVerbose )
{
ABC_PRT( "Choicing time ", Abc_Clock() - clk );
}
    return pMan;
//    return NULL;
}